

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32WaveGenerator.cpp
# Opt level: O1

void __thiscall
MT32Emu::LA32WaveGenerator::generateNextResonanceWaveLogSample(LA32WaveGenerator *this)

{
  Tables *pTVar1;
  sbyte sVar2;
  uint uVar3;
  int iVar4;
  
  if ((this->resonancePhase | NEGATIVE_FALLING_RESONANCE_SINE_SEGMENT) ==
      NEGATIVE_RISING_RESONANCE_SINE_SEGMENT) {
    pTVar1 = Tables::getInstance();
    uVar3 = ~this->resonanceSinePosition;
  }
  else {
    pTVar1 = Tables::getInstance();
    uVar3 = this->resonanceSinePosition;
  }
  iVar4 = (this->amp >> 10) + (uint)pTVar1->logsin9[uVar3 >> 9 & 0x1ff] * 4 +
          this->resonanceAmpSubtraction +
          ((this->resonanceSinePosition >> 4) *
           ((uint)(2 < (int)this->phase) + this->resAmpDecayFactor) >> 8);
  switch(this->phase) {
  case POSITIVE_RISING_SINE_SEGMENT:
  case NEGATIVE_FALLING_SINE_SEGMENT:
    pTVar1 = Tables::getInstance();
    uVar3 = this->squareWavePosition;
    sVar2 = 2;
    break;
  default:
    goto switchD_00120107_caseD_1;
  case POSITIVE_FALLING_SINE_SEGMENT:
  case NEGATIVE_RISING_SINE_SEGMENT:
    pTVar1 = Tables::getInstance();
    uVar3 = ~this->squareWavePosition;
    sVar2 = 3;
  }
  iVar4 = iVar4 + ((uint)pTVar1->logsin9[uVar3 >> 9 & 0x1ff] << sVar2);
switchD_00120107_caseD_1:
  uVar3 = this->cutoffVal;
  if (uVar3 < 0x2000000) {
    iVar4 = iVar4 + (0x2000000 - uVar3 >> 9) + 0x7bff;
  }
  else if (uVar3 < 0x2400000) {
    pTVar1 = Tables::getInstance();
    iVar4 = iVar4 + (uint)pTVar1->logsin9[uVar3 + 0xfe000000 >> 0xd] * 4;
  }
  uVar3 = 0xffff;
  if (iVar4 - 0x1000U < 0x10000) {
    uVar3 = iVar4 - 0x1000U;
  }
  (this->resonanceLogSample).logValue = (Bit16u)uVar3;
  (this->resonanceLogSample).sign = (uint)(1 < (int)this->resonancePhase);
  return;
}

Assistant:

void LA32WaveGenerator::generateNextResonanceWaveLogSample() {
	Bit32u logSampleValue;
	if (resonancePhase == POSITIVE_FALLING_RESONANCE_SINE_SEGMENT || resonancePhase == NEGATIVE_RISING_RESONANCE_SINE_SEGMENT) {
		logSampleValue = Tables::getInstance().logsin9[~(resonanceSinePosition >> 9) & 511];
	} else {
		logSampleValue = Tables::getInstance().logsin9[(resonanceSinePosition >> 9) & 511];
	}
	logSampleValue <<= 2;
	logSampleValue += amp >> 10;

	// From the digital captures, the decaying speed of the resonance sine is found a bit different for the positive and the negative segments
	Bit32u decayFactor = phase < NEGATIVE_FALLING_SINE_SEGMENT ? resAmpDecayFactor : resAmpDecayFactor + 1;
	// Unsure about resonanceSinePosition here. It's possible that dedicated counter & decrement are used. Although, cutoff is finely ramped, so maybe not.
	logSampleValue += resonanceAmpSubtraction + (((resonanceSinePosition >> 4) * decayFactor) >> 8);

	// To ensure the output wave has no breaks, two different windows are applied to the beginning and the ending of the resonance sine segment
	if (phase == POSITIVE_RISING_SINE_SEGMENT || phase == NEGATIVE_FALLING_SINE_SEGMENT) {
		// The window is synchronous sine here
		logSampleValue += Tables::getInstance().logsin9[(squareWavePosition >> 9) & 511] << 2;
	} else if (phase == POSITIVE_FALLING_SINE_SEGMENT || phase == NEGATIVE_RISING_SINE_SEGMENT) {
		// The window is synchronous square sine here
		logSampleValue += Tables::getInstance().logsin9[~(squareWavePosition >> 9) & 511] << 3;
	}

	if (cutoffVal < MIDDLE_CUTOFF_VALUE) {
		// For the cutoff values below the cutoff middle point, it seems the amp of the resonance wave is exponentially decayed
		logSampleValue += 31743 + ((MIDDLE_CUTOFF_VALUE - cutoffVal) >> 9);
	} else if (cutoffVal < RESONANCE_DECAY_THRESHOLD_CUTOFF_VALUE) {
		// For the cutoff values below this point, the amp of the resonance wave is sinusoidally decayed
		Bit32u sineIx = (cutoffVal - MIDDLE_CUTOFF_VALUE) >> 13;
		logSampleValue += Tables::getInstance().logsin9[sineIx] << 2;
	}

	// After all the amp decrements are added, it should be safe now to adjust the amp of the resonance wave to what we see on captures
	logSampleValue -= 1 << 12;

	resonanceLogSample.logValue = logSampleValue < 65536 ? Bit16u(logSampleValue) : 65535;
	resonanceLogSample.sign = resonancePhase < NEGATIVE_FALLING_RESONANCE_SINE_SEGMENT ? LogSample::POSITIVE : LogSample::NEGATIVE;
}